

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool runCommand(Options *options,QString *command)

{
  char *__s;
  FILE *pFVar1;
  undefined8 __stream;
  char *pcVar2;
  undefined8 *puVar3;
  pointer __old_p;
  long in_FS_OFFSET;
  UP runCommand;
  char buffer [4096];
  undefined1 local_1030 [16];
  undefined8 *local_1020;
  long local_28;
  
  pFVar1 = _stdout;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (options->verbose == true) {
    QString::toLocal8Bit((QByteArray *)(local_1030 + 8),command);
    puVar3 = local_1020;
    if (local_1020 == (undefined8 *)0x0) {
      puVar3 = &QByteArray::_empty;
    }
    fprintf(pFVar1,"Running command \'%s\'\n",puVar3);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(local_1030 + 8));
  }
  local_1030._0_8_ = (__uniq_ptr_impl<_IO_FILE,_Closer>)0xaaaaaaaaaaaaaaaa;
  openProcess((QString *)local_1030);
  __stream = local_1030._0_8_;
  pFVar1 = _stderr;
  if ((FILE *)local_1030._0_8_ == (FILE *)0x0) {
    QString::toLocal8Bit((QByteArray *)(local_1030 + 8),command);
    if (local_1020 == (undefined8 *)0x0) {
      local_1020 = &QByteArray::_empty;
    }
    fprintf(pFVar1,"Cannot run command \'%s\'\n",local_1020);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(local_1030 + 8));
  }
  else {
    __s = local_1030 + 8;
    memset(__s,0xaa,0x1000);
    while( true ) {
      pcVar2 = fgets(__s,0x1000,(FILE *)__stream);
      if (pcVar2 == (char *)0x0) break;
      if (options->verbose == true) {
        fputs(__s,_stdout);
      }
    }
    local_1030._0_8_ = (__uniq_ptr_impl<_IO_FILE,_Closer>)0x0;
    pclose((FILE *)__stream);
    fflush(_stdout);
    fflush(_stderr);
  }
  std::unique_ptr<_IO_FILE,_Closer>::~unique_ptr((unique_ptr<_IO_FILE,_Closer> *)local_1030);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (FILE *)__stream != (FILE *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool runCommand(const Options &options, const QString &command)
{
    if (options.verbose)
        fprintf(stdout, "Running command '%s'\n", qPrintable(command));

    auto runCommand = openProcess(command);
    if (runCommand == nullptr) {
        fprintf(stderr, "Cannot run command '%s'\n", qPrintable(command));
        return false;
    }
    char buffer[4096];
    while (fgets(buffer, sizeof(buffer), runCommand.get()) != nullptr) {
        if (options.verbose)
            fprintf(stdout, "%s", buffer);
    }
    runCommand.reset();
    fflush(stdout);
    fflush(stderr);
    return true;
}